

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::DestroyImage::exec(DestroyImage *this,Thread *t)

{
  _func_int **pp_Var1;
  deUint32 err;
  Thread *pTVar2;
  MessageBuilder *pMVar3;
  undefined1 local_1b0 [400];
  
  pTVar2 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar2 != (Thread *)0x0) {
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- eglDestroyImageKHR(");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,
                        (void **)(*(long *)&pTVar2[1].m_random.m_rnd + 0x48));
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&((this->m_image).m_ptr)->image);
    std::operator<<((ostream *)&pMVar3->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    pp_Var1 = pTVar2[1].super_Thread._vptr_Thread;
    (**(code **)(*pp_Var1 + 0xa8))
              (pp_Var1,*(undefined8 *)(*(long *)&pTVar2[1].m_random.m_rnd + 0x48),
               ((this->m_image).m_ptr)->image);
    ((this->m_image).m_ptr)->image = (EGLImageKHR)0x0;
    err = (**(code **)(*pTVar2[1].super_Thread._vptr_Thread + 0xf8))();
    eglu::checkError(err,"eglDestroyImageKHR()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                     ,0x7af);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- eglDestroyImageKHR()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void DestroyImage::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- eglDestroyImageKHR(" << thread.runtimeContext->display << ", " << m_image->image << ")" << tcu::ThreadUtil::Message::End;
	thread.egl.destroyImageKHR(thread.runtimeContext->display, m_image->image);
	m_image->image = EGL_NO_IMAGE_KHR;
	EGLU_CHECK_MSG(thread.egl, "eglDestroyImageKHR()");
	thread.newMessage() << "End -- eglDestroyImageKHR()" << tcu::ThreadUtil::Message::End;
}